

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hive_partitioning.cpp
# Opt level: O1

map<unsigned_long,_const_duckdb::HivePartitionKey_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>_>_>
* __thiscall
duckdb::HivePartitionedColumnData::GetReverseMap
          (map<unsigned_long,_const_duckdb::HivePartitionKey_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>_>_>
           *__return_storage_ptr__,HivePartitionedColumnData *this)

{
  _Rb_tree_header *p_Var1;
  mapped_type *ppHVar2;
  _Hash_node_base *p_Var3;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (p_Var3 = (this->local_partition_map)._M_h._M_before_begin._M_nxt;
      p_Var3 != (_Hash_node_base *)0x0; p_Var3 = p_Var3->_M_nxt) {
    ppHVar2 = std::
              map<unsigned_long,_const_duckdb::HivePartitionKey_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>_>_>
              ::operator[](__return_storage_ptr__,(key_type *)(p_Var3 + 5));
    *ppHVar2 = (mapped_type)(p_Var3 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<idx_t, const HivePartitionKey *> HivePartitionedColumnData::GetReverseMap() {
	std::map<idx_t, const HivePartitionKey *> ret;
	for (const auto &pair : local_partition_map) {
		ret[pair.second] = &(pair.first);
	}
	return ret;
}